

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledOutputFile::~TiledOutputFile(TiledOutputFile *this)

{
  undefined8 uVar1;
  GenericOutputFile *in_RDI;
  OStream *in_stack_00000018;
  TileOffsets *in_stack_00000020;
  uint64_t originalPosition;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  _func_int **pp_Var2;
  Data *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__TiledOutputFile_002ad458;
  if (in_RDI[1]._vptr_GenericOutputFile != (_func_int **)0x0) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    uVar1 = (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x18))();
    if (in_RDI[1]._vptr_GenericOutputFile[0x25] != (_func_int *)0x0) {
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x20))
                (in_RDI[2]._vptr_GenericOutputFile[5],in_RDI[1]._vptr_GenericOutputFile[0x25]);
      TileOffsets::writeTo(in_stack_00000020,in_stack_00000018);
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x20))
                (in_RDI[2]._vptr_GenericOutputFile[5],uVar1);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2411ed);
    if (((((ulong)in_RDI[3]._vptr_GenericOutputFile & 1) != 0) &&
        (in_RDI[2]._vptr_GenericOutputFile != (_func_int **)0x0)) &&
       (in_RDI[2]._vptr_GenericOutputFile[5] != (_func_int *)0x0)) {
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 8))();
    }
    if ((*(int *)(in_RDI[1]._vptr_GenericOutputFile + 0x2e) == -1) &&
       (in_RDI[2]._vptr_GenericOutputFile != (_func_int **)0x0)) {
      operator_delete(in_RDI[2]._vptr_GenericOutputFile,0x38);
    }
    pp_Var2 = in_RDI[1]._vptr_GenericOutputFile;
    if (pp_Var2 != (_func_int **)0x0) {
      Data::~Data(in_stack_fffffffffffffff0);
      operator_delete(pp_Var2,0x178);
    }
  }
  GenericOutputFile::~GenericOutputFile(in_RDI);
  return;
}

Assistant:

TiledOutputFile::~TiledOutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_streamData);
#endif
            uint64_t originalPosition = _streamData->os->tellp ();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_deleteStream && _streamData) delete _streamData->os;

        if (_data->partNumber == -1) delete _streamData;

        delete _data;
    }
}